

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cpp
# Opt level: O1

void Dio(double *x,int x_length,int fs,DioOption *option,double *temporal_positions,double *f0)

{
  size_t __n;
  double dVar1;
  double allowed_range;
  bool bVar2;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  fft_plan p_04;
  fft_plan p_05;
  undefined8 uVar3;
  undefined8 uVar4;
  double *pdVar5;
  int i_2;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint x_length_00;
  double *pdVar13;
  fft_complex *out;
  double *pdVar14;
  ulong uVar15;
  fft_complex *padVar16;
  double **f0_candidates;
  long *plVar17;
  void *pvVar18;
  void *pvVar19;
  double *pdVar20;
  double *interval_locations;
  double *interval_locations_00;
  double *intervals;
  double *intervals_00;
  double *intervals_01;
  double *intervals_02;
  void *__dest;
  void *pvVar21;
  void *pvVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  int i;
  uint number_of_candidates;
  fft_plan *pfVar29;
  undefined8 *puVar30;
  ulong uVar31;
  void *pvVar32;
  ulong uVar33;
  ulong uVar34;
  undefined8 *puVar35;
  long lVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  byte bVar45;
  double dVar46;
  double *pdVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  int kMaximumNumber;
  fft_plan forwardFFT;
  fft_plan inverseFFT;
  undefined8 uStackY_278;
  undefined1 in_stack_fffffffffffffd90 [32];
  undefined1 in_stack_fffffffffffffdb0 [40];
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 uVar58;
  double **ppdVar59;
  undefined1 local_c8 [16];
  fft_complex *local_b8;
  double *local_b0;
  fft_complex *local_a8;
  fft_plan local_78;
  
  bVar45 = 0;
  dVar50 = option->frame_period;
  dVar1 = option->f0_floor;
  dVar49 = option->f0_ceil;
  dVar51 = option->channels_in_octave;
  iVar23 = option->speed;
  allowed_range = option->allowed_range;
  dVar46 = log(dVar49 / dVar1);
  iVar41 = (int)((dVar46 / 0.6931471805599453) * dVar51);
  number_of_candidates = iVar41 + 1;
  uVar33 = (long)(int)number_of_candidates << 3;
  if (iVar41 < -1) {
    uVar33 = 0xffffffffffffffff;
  }
  pdVar13 = (double *)operator_new__(uVar33);
  uVar39 = (ulong)number_of_candidates;
  if (-1 < iVar41) {
    uVar34 = 0;
    do {
      uVar31 = uVar34 + 1;
      dVar46 = exp2((double)(int)uVar31 / dVar51);
      pdVar13[uVar34] = dVar46 * dVar1;
      uVar34 = uVar31;
    } while (uVar39 != uVar31);
  }
  iVar38 = 0xc;
  if (iVar23 < 0xc) {
    iVar38 = iVar23;
  }
  iVar11 = 1;
  if (1 < iVar38) {
    iVar11 = iVar38;
  }
  lVar24 = (long)x_length;
  uVar31 = lVar24 / (long)iVar11 & 0xffffffff;
  dVar51 = (double)fs;
  dVar46 = dVar51 / (double)iVar11;
  pdVar47 = (double *)(dVar46 / 50.0);
  iVar6 = matlab_round((double)pdVar47);
  iVar38 = (int)(lVar24 / (long)iVar11);
  uVar7 = GetSuitableFFTSize(iVar38 + iVar6 * 2 + (int)((dVar46 / *pdVar13) * 0.5 + 1.0) * 4 + 2);
  uVar34 = (long)(int)uVar7 << 4;
  if ((int)uVar7 < 0) {
    uVar34 = 0xffffffffffffffff;
  }
  uVar40 = (long)(int)uVar7 * 8;
  if ((int)uVar7 < 0) {
    uVar40 = 0xffffffffffffffff;
  }
  out = (fft_complex *)operator_new__(uVar34);
  pdVar14 = (double *)operator_new__(uVar40);
  uVar44 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    memset(pdVar14,0,uVar44 * 8);
  }
  uVar8 = iVar38 + 1;
  if (iVar23 < 2) {
    if (0 < x_length) {
      memcpy(pdVar14,x,(ulong)(uint)x_length << 3);
    }
  }
  else {
    decimate(x,x_length,iVar11,pdVar14);
  }
  uVar28 = (ulong)uVar8;
  dVar48 = 0.0;
  if (-1 < iVar38) {
    uVar15 = 0;
    do {
      dVar48 = dVar48 + pdVar14[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar28 != uVar15);
  }
  if (-1 < iVar38) {
    uVar15 = 0;
    do {
      pdVar14[uVar15] = pdVar14[uVar15] - dVar48 / (double)(int)uVar8;
      uVar15 = uVar15 + 1;
    } while (uVar28 != uVar15);
  }
  if ((int)uVar8 < (int)uVar7) {
    memset(pdVar14 + (int)uVar8,0,(ulong)((uVar7 - iVar38) - 2) * 8 + 8);
  }
  fft_plan_dft_r2c_1d((fft_plan *)local_c8,uVar7,pdVar14,out,3);
  pfVar29 = (fft_plan *)local_c8;
  puVar30 = &uStackY_278;
  for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar30 = *(undefined8 *)pfVar29;
    pfVar29 = (fft_plan *)((long)pfVar29 + (ulong)bVar45 * -0x10 + 8);
    puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
  }
  p_02.out._0_4_ = in_stack_fffffffffffffdd8;
  p_02.n = in_stack_fffffffffffffdb0._0_4_;
  p_02.sign = in_stack_fffffffffffffdb0._4_4_;
  p_02.flags = in_stack_fffffffffffffdb0._8_4_;
  p_02._12_4_ = in_stack_fffffffffffffdb0._12_4_;
  p_02.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
  p_02.in = (double *)in_stack_fffffffffffffdb0._24_8_;
  p_02.c_out = (fft_complex *)in_stack_fffffffffffffdb0._32_8_;
  p_02.out._4_4_ = in_stack_fffffffffffffddc;
  p_02.input._0_4_ = x_length;
  p_02.input._4_4_ = in_stack_fffffffffffffde4;
  p_02.ip = (int *)dVar51;
  p_02.w = pdVar47;
  fft_execute(p_02);
  uVar9 = matlab_round((double)pdVar47);
  uVar12 = uVar9 * 2;
  uVar10 = uVar9 * 2 + 1;
  if (-1 < (int)uVar9) {
    pdVar47 = (double *)(double)(int)(uVar12 + 2);
    uVar42 = 2;
    lVar24 = 0;
    do {
      dVar48 = cos(((double)uVar42 * 3.141592653589793) / (double)pdVar47);
      pdVar14[lVar24] = dVar48 * -0.5 + 0.5;
      lVar24 = lVar24 + 1;
      uVar42 = uVar42 + 2;
    } while ((ulong)uVar12 + 1 != lVar24);
  }
  if ((int)uVar10 < (int)uVar7) {
    memset(pdVar14 + (int)uVar10,0,(ulong)((uVar12 ^ 0xfffffffe) + uVar7) * 8 + 8);
  }
  uVar15 = (ulong)uVar10;
  dVar48 = 0.0;
  if (-1 < (int)uVar9) {
    uVar25 = 0;
    do {
      dVar48 = dVar48 + pdVar14[uVar25];
      uVar25 = uVar25 + 1;
    } while (uVar15 != uVar25);
  }
  if (-1 < (int)uVar9) {
    uVar25 = 0;
    do {
      pdVar14[uVar25] = -pdVar14[uVar25] / dVar48;
      uVar25 = uVar25 + 1;
    } while (uVar15 != uVar25);
  }
  if (0 < (int)uVar9) {
    uVar25 = 0;
    do {
      pdVar14[(long)(int)(uVar7 - uVar9) + uVar25] = pdVar14[uVar25];
      uVar25 = uVar25 + 1;
    } while (uVar9 != uVar25);
  }
  pdVar20 = pdVar14;
  if (-1 < (int)uVar9) {
    do {
      *pdVar20 = pdVar20[uVar9];
      uVar15 = uVar15 - 1;
      pdVar20 = pdVar20 + 1;
    } while (uVar15 != 0);
  }
  *pdVar14 = *pdVar14 + 1.0;
  padVar16 = (fft_complex *)operator_new__(uVar34);
  local_a8 = padVar16;
  puVar30 = (undefined8 *)local_c8;
  puVar35 = &uStackY_278;
  for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar35 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
    puVar35 = puVar35 + (ulong)bVar45 * -2 + 1;
  }
  p_03.out._0_4_ = in_stack_fffffffffffffdd8;
  p_03.n = in_stack_fffffffffffffdb0._0_4_;
  p_03.sign = in_stack_fffffffffffffdb0._4_4_;
  p_03.flags = in_stack_fffffffffffffdb0._8_4_;
  p_03._12_4_ = in_stack_fffffffffffffdb0._12_4_;
  p_03.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
  p_03.in = (double *)in_stack_fffffffffffffdb0._24_8_;
  p_03.c_out = (fft_complex *)in_stack_fffffffffffffdb0._32_8_;
  p_03.out._4_4_ = in_stack_fffffffffffffddc;
  p_03.input._0_4_ = x_length;
  p_03.input._4_4_ = in_stack_fffffffffffffde4;
  p_03.ip = (int *)dVar51;
  p_03.w = pdVar47;
  fft_execute(p_03);
  if (-2 < (int)uVar7) {
    lVar24 = 0;
    do {
      dVar48 = *(double *)((long)*out + lVar24);
      dVar52 = *(double *)((long)*out + lVar24 + 8);
      dVar53 = *(double *)((long)*padVar16 + lVar24);
      dVar54 = *(double *)((long)*padVar16 + lVar24 + 8);
      *(double *)((long)*out + lVar24 + 8) = dVar48 * dVar54 + dVar53 * dVar52;
      *(double *)((long)*out + lVar24) = dVar48 * dVar53 - dVar54 * dVar52;
      lVar24 = lVar24 + 0x10;
    } while ((ulong)((int)uVar7 / 2 + 1) << 4 != lVar24);
  }
  puVar30 = (undefined8 *)local_c8;
  puVar35 = &uStackY_278;
  for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
    *puVar35 = *puVar30;
    puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
    puVar35 = puVar35 + (ulong)bVar45 * -2 + 1;
  }
  p.c_out = (fft_complex *)in_stack_fffffffffffffdb0._0_8_;
  p.out = (double *)in_stack_fffffffffffffdb0._8_8_;
  p.input = (double *)in_stack_fffffffffffffdb0._16_8_;
  p.ip = (int *)in_stack_fffffffffffffdb0._24_8_;
  p.w = (double *)in_stack_fffffffffffffdb0._32_8_;
  p.n = in_stack_fffffffffffffd90._0_4_;
  p.sign = in_stack_fffffffffffffd90._4_4_;
  p.flags = in_stack_fffffffffffffd90._8_4_;
  p._12_4_ = in_stack_fffffffffffffd90._12_4_;
  p.c_in = (fft_complex *)in_stack_fffffffffffffd90._16_8_;
  p.in = (double *)in_stack_fffffffffffffd90._24_8_;
  fft_destroy_plan(p);
  operator_delete__(pdVar14);
  operator_delete__(padVar16);
  f0_candidates = (double **)operator_new__(uVar33);
  plVar17 = (long *)operator_new__(uVar33);
  iVar23 = (int)((((double)x_length * 1000.0) / dVar51) / dVar50);
  uVar56 = 0;
  uVar10 = iVar23 + 1;
  lVar24 = (long)(int)uVar10;
  if (-1 < iVar41) {
    uVar33 = 0xffffffffffffffff;
    if (-2 < iVar23) {
      uVar33 = lVar24 * 8;
    }
    uVar15 = 0;
    do {
      pdVar47 = (double *)operator_new__(uVar33);
      f0_candidates[uVar15] = pdVar47;
      pvVar18 = operator_new__(uVar33);
      plVar17[uVar15] = (long)pvVar18;
      uVar15 = uVar15 + 1;
    } while (uVar39 != uVar15);
  }
  uVar33 = (ulong)uVar10;
  if (-1 < iVar23) {
    uVar15 = 0;
    do {
      temporal_positions[uVar15] = ((double)(int)uVar15 * dVar50) / 1000.0;
      uVar15 = uVar15 + 1;
    } while (uVar33 != uVar15);
  }
  uVar15 = lVar24 * 8;
  if (iVar23 < -1) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar15);
  pvVar19 = operator_new__(uVar15);
  uVar57 = SUB84(pvVar19,0);
  uVar58 = (undefined4)((ulong)pvVar19 >> 0x20);
  if (-1 < iVar41) {
    uVar25 = (long)(int)uVar8 << 3;
    if (iVar38 < -1) {
      uVar25 = 0xffffffffffffffff;
    }
    __n = uVar33 * 8;
    uVar37 = 0;
    do {
      dVar51 = pdVar13[uVar37];
      pdVar47 = (double *)operator_new__(uVar40);
      iVar11 = matlab_round((dVar46 / dVar51) * 0.5);
      pdVar14 = (double *)operator_new__(uVar40);
      uVar12 = iVar11 * 4;
      NuttallWindow(uVar12,pdVar14);
      if ((int)uVar12 < (int)uVar7) {
        memset(pdVar14 + (int)uVar12,0,(ulong)(~uVar12 + uVar7) * 8 + 8);
      }
      padVar16 = (fft_complex *)operator_new__(uVar34);
      fft_plan_dft_r2c_1d((fft_plan *)local_c8,uVar7,pdVar14,padVar16,3);
      pfVar29 = (fft_plan *)local_c8;
      puVar30 = &uStackY_278;
      for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar30 = *(undefined8 *)pfVar29;
        pfVar29 = (fft_plan *)((long)pfVar29 + (ulong)bVar45 * -0x10 + 8);
        puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
      }
      p_04.out._0_4_ = iVar23;
      p_04.n = in_stack_fffffffffffffdb0._0_4_;
      p_04.sign = in_stack_fffffffffffffdb0._4_4_;
      p_04.flags = in_stack_fffffffffffffdb0._8_4_;
      p_04._12_4_ = in_stack_fffffffffffffdb0._12_4_;
      p_04.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
      p_04.in = (double *)in_stack_fffffffffffffdb0._24_8_;
      p_04.c_out = (fft_complex *)in_stack_fffffffffffffdb0._32_8_;
      p_04.out._4_4_ = uVar56;
      p_04.input._0_4_ = uVar57;
      p_04.input._4_4_ = uVar58;
      p_04.ip = (int *)uVar33;
      p_04.w = (double *)f0_candidates;
      fft_execute(p_04);
      dVar48 = (*out)[0];
      dVar52 = (*out)[1];
      dVar53 = (*padVar16)[0];
      dVar54 = (*padVar16)[1];
      (*padVar16)[1] = dVar48 * dVar54 + dVar53 * dVar52;
      (*padVar16)[0] = dVar48 * dVar53 - dVar54 * dVar52;
      if (1 < (int)uVar7) {
        pdVar20 = padVar16[uVar44 - 2] + 1;
        uVar27 = 0;
        do {
          dVar48 = *(double *)((long)out[1] + uVar27);
          dVar52 = *(double *)((long)out[1] + uVar27 + 8);
          dVar53 = *(double *)((long)padVar16[1] + uVar27);
          dVar54 = *(double *)((long)padVar16[1] + uVar27 + 8);
          dVar55 = dVar48 * dVar53 - dVar54 * dVar52;
          dVar48 = dVar48 * dVar54 + dVar53 * dVar52;
          *(double *)((long)padVar16[1] + uVar27 + 8) = dVar48;
          *(double *)((long)padVar16[1] + uVar27) = dVar55;
          (*(fft_complex *)(pdVar20 + -1))[0] = dVar55;
          *pdVar20 = dVar48;
          uVar27 = uVar27 + 0x10;
          pdVar20 = pdVar20 + -2;
        } while ((uVar44 * 8 & 0xfffffffffffffff0) != uVar27);
      }
      fft_plan_dft_c2r_1d(&local_78,uVar7,padVar16,pdVar47,3);
      pfVar29 = &local_78;
      puVar30 = &uStackY_278;
      for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar30 = *(undefined8 *)pfVar29;
        pfVar29 = (fft_plan *)((long)pfVar29 + (ulong)bVar45 * -0x10 + 8);
        puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
      }
      p_05.out._0_4_ = iVar23;
      p_05.n = in_stack_fffffffffffffdb0._0_4_;
      p_05.sign = in_stack_fffffffffffffdb0._4_4_;
      p_05.flags = in_stack_fffffffffffffdb0._8_4_;
      p_05._12_4_ = in_stack_fffffffffffffdb0._12_4_;
      p_05.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
      p_05.in = (double *)in_stack_fffffffffffffdb0._24_8_;
      p_05.c_out = (fft_complex *)in_stack_fffffffffffffdb0._32_8_;
      p_05.out._4_4_ = uVar56;
      p_05.input._0_4_ = uVar57;
      p_05.input._4_4_ = uVar58;
      p_05.ip = (int *)uVar33;
      p_05.w = (double *)f0_candidates;
      fft_execute(p_05);
      if (-1 < iVar38) {
        pdVar20 = pdVar47;
        uVar27 = uVar28;
        do {
          *pdVar20 = pdVar20[iVar11 * 2];
          pdVar20 = pdVar20 + 1;
          uVar27 = uVar27 - 1;
        } while (uVar27 != 0);
      }
      pfVar29 = &local_78;
      puVar30 = &uStackY_278;
      for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar30 = *(undefined8 *)pfVar29;
        pfVar29 = (fft_plan *)((long)pfVar29 + ((ulong)bVar45 * -2 + 1) * 8);
        puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
      }
      p_00.c_out = (fft_complex *)in_stack_fffffffffffffdb0._0_8_;
      p_00.out = (double *)in_stack_fffffffffffffdb0._8_8_;
      p_00.input = (double *)in_stack_fffffffffffffdb0._16_8_;
      p_00.ip = (int *)in_stack_fffffffffffffdb0._24_8_;
      p_00.w = (double *)in_stack_fffffffffffffdb0._32_8_;
      p_00.n = in_stack_fffffffffffffd90._0_4_;
      p_00.sign = in_stack_fffffffffffffd90._4_4_;
      p_00.flags = in_stack_fffffffffffffd90._8_4_;
      p_00._12_4_ = in_stack_fffffffffffffd90._12_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffd90._16_8_;
      p_00.in = (double *)in_stack_fffffffffffffd90._24_8_;
      fft_destroy_plan(p_00);
      puVar30 = (undefined8 *)local_c8;
      puVar35 = &uStackY_278;
      for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar35 = *puVar30;
        puVar30 = puVar30 + (ulong)bVar45 * -2 + 1;
        puVar35 = puVar35 + (ulong)bVar45 * -2 + 1;
      }
      p_01.c_out = (fft_complex *)in_stack_fffffffffffffdb0._0_8_;
      p_01.out = (double *)in_stack_fffffffffffffdb0._8_8_;
      p_01.input = (double *)in_stack_fffffffffffffdb0._16_8_;
      p_01.ip = (int *)in_stack_fffffffffffffdb0._24_8_;
      p_01.w = (double *)in_stack_fffffffffffffdb0._32_8_;
      p_01.n = in_stack_fffffffffffffd90._0_4_;
      p_01.sign = in_stack_fffffffffffffd90._4_4_;
      p_01.flags = in_stack_fffffffffffffd90._8_4_;
      p_01._12_4_ = in_stack_fffffffffffffd90._12_4_;
      p_01.c_in = (fft_complex *)in_stack_fffffffffffffd90._16_8_;
      p_01.in = (double *)in_stack_fffffffffffffd90._24_8_;
      fft_destroy_plan(p_01);
      operator_delete__(padVar16);
      operator_delete__(pdVar14);
      pdVar14 = (double *)operator_new__(uVar25);
      pdVar20 = (double *)operator_new__(uVar25);
      interval_locations = (double *)operator_new__(uVar25);
      interval_locations_00 = (double *)operator_new__(uVar25);
      intervals = (double *)operator_new__(uVar25);
      intervals_00 = (double *)operator_new__(uVar25);
      intervals_01 = (double *)operator_new__(uVar25);
      intervals_02 = (double *)operator_new__(uVar25);
      uVar12 = anon_unknown.dwarf_a0be::ZeroCrossingEngine(pdVar47,uVar8,dVar46,pdVar14,intervals);
      if (-1 < iVar38) {
        uVar27 = 0;
        do {
          pdVar47[uVar27] = -pdVar47[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar28 != uVar27);
      }
      uVar9 = anon_unknown.dwarf_a0be::ZeroCrossingEngine(pdVar47,uVar8,dVar46,pdVar20,intervals_00)
      ;
      if (0 < iVar38) {
        uVar27 = 0;
        do {
          pdVar47[uVar27] = pdVar47[uVar27] - pdVar47[uVar27 + 1];
          uVar27 = uVar27 + 1;
        } while (uVar31 != uVar27);
      }
      uVar42 = anon_unknown.dwarf_a0be::ZeroCrossingEngine
                         (pdVar47,iVar38,dVar46,interval_locations,intervals_01);
      if (0 < iVar38) {
        uVar27 = 0;
        do {
          pdVar47[uVar27] = -pdVar47[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar31 != uVar27);
      }
      x_length_00 = anon_unknown.dwarf_a0be::ZeroCrossingEngine
                              (pdVar47,iVar38,dVar46,interval_locations_00,intervals_02);
      if ((((uVar12 < 3) || (uVar9 < 3)) || (uVar42 < 3)) || (x_length_00 < 3)) {
        if (-1 < iVar23) {
          memset(pvVar18,0,__n);
          uVar27 = 0;
          lVar26 = CONCAT44(uVar58,uVar57);
          do {
            *(undefined8 *)(lVar26 + uVar27 * 8) = 0x40f86a0000000000;
            uVar27 = uVar27 + 1;
          } while (uVar33 != uVar27);
          goto LAB_00106de1;
        }
        operator_delete__(pdVar14);
        operator_delete__(pdVar20);
        operator_delete__(interval_locations);
        operator_delete__(interval_locations_00);
        operator_delete__(intervals);
        operator_delete__(intervals_00);
        operator_delete__(intervals_01);
        operator_delete__(intervals_02);
        operator_delete__(pdVar47);
      }
      else {
        lVar26 = 0;
        uVar27 = uVar33;
        do {
          pvVar19 = operator_new__(uVar15);
          *(void **)(local_c8 + lVar26 * 8) = pvVar19;
          uVar3 = local_c8._0_8_;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 4);
        interp1(pdVar14,intervals,uVar12,temporal_positions,uVar10,(double *)local_c8._0_8_);
        uVar4 = local_c8._8_8_;
        interp1(pdVar20,intervals_00,uVar9,temporal_positions,uVar10,(double *)local_c8._8_8_);
        padVar16 = local_b8;
        interp1(interval_locations,intervals_01,uVar42,temporal_positions,uVar10,*local_b8);
        pdVar5 = local_b0;
        interp1(interval_locations_00,intervals_02,x_length_00,temporal_positions,uVar10,local_b0);
        uVar33 = uVar27;
        if (-1 < iVar23) {
          uVar43 = 0;
          do {
            dVar52 = (*(double *)(uVar3 + uVar43 * 8) + *(double *)(uVar4 + uVar43 * 8) +
                      (*padVar16)[uVar43] + pdVar5[uVar43]) * 0.25;
            *(double *)((long)pvVar18 + uVar43 * 8) = dVar52;
            dVar48 = *(double *)(uVar3 + uVar43 * 8) - dVar52;
            dVar53 = *(double *)(uVar4 + uVar43 * 8) - dVar52;
            dVar54 = (*padVar16)[uVar43] - dVar52;
            dVar52 = pdVar5[uVar43] - dVar52;
            dVar48 = (dVar52 * dVar52 + dVar54 * dVar54 + dVar48 * dVar48 + dVar53 * dVar53) / 3.0;
            if (dVar48 < 0.0) {
              uVar27 = uVar33;
              dVar48 = sqrt(dVar48);
              uVar33 = uVar27;
            }
            else {
              dVar48 = SQRT(dVar48);
            }
            *(double *)(CONCAT44(uVar58,uVar57) + uVar43 * 8) = dVar48;
            dVar48 = *(double *)((long)pvVar18 + uVar43 * 8);
            if (((dVar48 < dVar1) || (dVar49 < dVar48)) ||
               ((dVar51 < dVar48 || (dVar48 < dVar51 * 0.5)))) {
              *(undefined8 *)((long)pvVar18 + uVar43 * 8) = 0;
              *(undefined8 *)(CONCAT44(uVar58,uVar57) + uVar43 * 8) = 0x40f86a0000000000;
            }
            uVar43 = uVar43 + 1;
          } while (uVar27 != uVar43);
        }
        lVar26 = 0;
        do {
          if (*(void **)(local_c8 + lVar26 * 8) != (void *)0x0) {
            operator_delete__(*(void **)(local_c8 + lVar26 * 8));
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 != 4);
        lVar26 = CONCAT44(uVar58,uVar57);
LAB_00106de1:
        operator_delete__(pdVar14);
        operator_delete__(pdVar20);
        operator_delete__(interval_locations);
        operator_delete__(interval_locations_00);
        operator_delete__(intervals);
        operator_delete__(intervals_00);
        operator_delete__(intervals_01);
        operator_delete__(intervals_02);
        operator_delete__(pdVar47);
        if (-1 < iVar23) {
          lVar36 = plVar17[uVar37];
          pdVar47 = f0_candidates[uVar37];
          uVar27 = 0;
          do {
            *(double *)(lVar36 + uVar27 * 8) =
                 *(double *)(lVar26 + uVar27 * 8) /
                 (*(double *)((long)pvVar18 + uVar27 * 8) + 1e-12);
            pdVar47[uVar27] = *(double *)((long)pvVar18 + uVar27 * 8);
            uVar27 = uVar27 + 1;
          } while (uVar33 != uVar27);
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != uVar39);
  }
  ppdVar59 = f0_candidates;
  operator_delete__(pvVar18);
  operator_delete__((void *)CONCAT44(uVar58,uVar57));
  pvVar18 = operator_new__(uVar15);
  if (-1 < iVar23) {
    lVar26 = *plVar17;
    pdVar47 = *f0_candidates;
    uVar34 = 0;
    do {
      dVar49 = *(double *)(lVar26 + uVar34 * 8);
      *(double *)((long)pvVar18 + uVar34 * 8) = pdVar47[uVar34];
      if (0 < iVar41) {
        uVar31 = 1;
        do {
          dVar51 = *(double *)(plVar17[uVar31] + uVar34 * 8);
          if (dVar51 < dVar49) {
            *(double *)((long)pvVar18 + uVar34 * 8) = f0_candidates[uVar31][uVar34];
            dVar49 = dVar51;
          }
          uVar31 = uVar31 + 1;
        } while (uVar39 != uVar31);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar33);
  }
  iVar38 = (int)((1000.0 / dVar50) / dVar1 + 0.5);
  if (iVar38 * 2 < iVar23) {
    uVar7 = iVar38 * 2 + 1;
    pvVar19 = operator_new__(uVar15);
    __dest = operator_new__(uVar15);
    pvVar21 = operator_new__(uVar15);
    f0_candidates = ppdVar59;
    if (-1 < iVar38) {
      memset(pvVar21,0,(ulong)uVar7 * 8);
      f0_candidates = ppdVar59;
    }
    if ((int)uVar7 < (int)(uVar10 - uVar7)) {
      memcpy((void *)((long)pvVar21 + (long)(int)uVar7 * 8),
             (void *)((long)pvVar18 + (long)(int)uVar7 * 8),(ulong)(iVar23 + uVar7 * -2) * 8 + 8);
    }
    if (-1 < iVar38) {
      uVar8 = (iVar23 - uVar7) + 2;
      if ((int)uVar8 < (int)uVar10) {
        uVar8 = uVar10;
      }
      memset((void *)((long)pvVar21 + (long)(int)(uVar10 - uVar7) * 8),0,
             (ulong)((uVar8 + (uVar7 - iVar23)) - 2) * 8 + 8);
      memset(pvVar19,0,(ulong)uVar7 << 3);
    }
    lVar26 = (long)(int)uVar7;
    do {
      dVar50 = *(double *)((long)pvVar21 + lVar26 * 8);
      *(ulong *)((long)pvVar19 + lVar26 * 8) =
           -(ulong)(ABS((dVar50 - *(double *)((long)pvVar21 + lVar26 * 8 + -8)) / (dVar50 + 1e-12))
                   < allowed_range) & (ulong)dVar50;
      lVar26 = lVar26 + 1;
    } while (lVar24 != lVar26);
    operator_delete__(pvVar21);
    if (-1 < iVar23) {
      memcpy(__dest,pvVar19,uVar33 * 8);
    }
    if (iVar38 < (int)(uVar10 - iVar38)) {
      iVar11 = -iVar38;
      lVar26 = (long)iVar38;
      if (iVar38 != iVar11 && SBORROW4(iVar38,iVar11) == iVar38 * 2 < 0) {
        iVar11 = iVar38;
      }
      pvVar21 = pvVar19;
      do {
        if (-1 < iVar38) {
          lVar36 = 0;
          do {
            dVar50 = *(double *)((long)pvVar21 + lVar36 * 8);
            if ((dVar50 == 0.0) && (!NAN(dVar50))) {
              *(undefined8 *)((long)__dest + lVar26 * 8) = 0;
              break;
            }
            lVar36 = lVar36 + 1;
          } while (iVar11 + iVar38 + 1 != (int)lVar36);
        }
        lVar26 = lVar26 + 1;
        pvVar21 = (void *)((long)pvVar21 + 8);
      } while (lVar26 != (int)(uVar10 - iVar38));
    }
    uVar34 = 0xffffffffffffffff;
    if (-2 < iVar23) {
      uVar34 = lVar24 << 2;
    }
    iVar38 = iVar23;
    pvVar21 = operator_new__(uVar34);
    pvVar22 = operator_new__(uVar34);
    if (iVar23 < 1) {
      uVar34 = 0;
      uVar31 = 0;
    }
    else {
      uVar40 = 1;
      uVar34 = 0;
      uVar31 = 0;
      do {
        dVar50 = *(double *)((long)__dest + uVar40 * 8);
        iVar23 = (int)uVar40;
        if (((dVar50 != 0.0) || (NAN(dVar50))) ||
           ((dVar1 = *(double *)((long)__dest + uVar40 * 8 + -8), dVar1 == 0.0 && (!NAN(dVar1))))) {
          if ((((dVar50 != 0.0) || (NAN(dVar50))) &&
              (dVar50 = *(double *)((long)__dest + uVar40 * 8 + -8), dVar50 == 0.0)) &&
             (!NAN(dVar50))) {
            iVar11 = (int)uVar34;
            uVar34 = (ulong)(iVar11 + 1);
            pvVar32 = pvVar21;
            goto LAB_00107292;
          }
        }
        else {
          iVar23 = iVar23 + -1;
          iVar11 = (int)uVar31;
          uVar31 = (ulong)(iVar11 + 1);
          pvVar32 = pvVar22;
LAB_00107292:
          *(int *)((long)pvVar32 + (long)iVar11 * 4) = iVar23;
        }
        uVar40 = uVar40 + 1;
      } while (uVar33 != uVar40);
    }
    if (-1 < iVar38) {
      memcpy(pvVar19,__dest,uVar33 * 8);
    }
    if (0 < (int)uVar31) {
      iVar23 = (int)uVar31 + -1;
      uVar56 = 0;
      uVar40 = 0;
      do {
        iVar11 = iVar38;
        if (uVar40 != CONCAT44(uVar56,iVar23)) {
          iVar11 = *(int *)((long)pvVar22 + uVar40 * 4 + 4);
        }
        iVar6 = *(int *)((long)pvVar22 + uVar40 * 4);
        lVar24 = (long)iVar6;
        if (iVar11 <= iVar6) {
          iVar11 = iVar6;
        }
        lVar26 = 0;
        do {
          if (iVar11 - lVar24 == lVar26) break;
          dVar50 = anon_unknown.dwarf_a0be::SelectBestF0
                             (*(double *)((long)pvVar19 + lVar26 * 8 + lVar24 * 8),
                              *(double *)((long)pvVar19 + lVar26 * 8 + lVar24 * 8 + -8),
                              f0_candidates,number_of_candidates,iVar6 + 1 + (int)lVar26,
                              allowed_range);
          *(double *)((long)pvVar19 + lVar26 * 8 + lVar24 * 8 + 8) = dVar50;
          lVar26 = lVar26 + 1;
        } while ((dVar50 != 0.0) || (NAN(dVar50)));
        uVar40 = uVar40 + 1;
      } while (uVar40 != uVar31);
    }
    if (-1 < iVar38) {
      memcpy(f0,pvVar19,uVar33 << 3);
    }
    if (0 < (int)uVar34) {
      do {
        uVar33 = uVar34 - 1;
        if (uVar33 == 0) {
          lVar24 = 1;
        }
        else {
          lVar24 = (long)*(int *)((long)pvVar21 + uVar34 * 4 + -8);
        }
        iVar23 = *(int *)((long)pvVar21 + uVar33 * 4);
        iVar38 = iVar23 + -1;
        lVar26 = (long)iVar23;
        do {
          if (lVar26 <= lVar24) break;
          lVar36 = lVar26 + -1;
          dVar50 = anon_unknown.dwarf_a0be::SelectBestF0
                             (f0[lVar26],f0[lVar26 + 1],f0_candidates,number_of_candidates,iVar38,
                              allowed_range);
          f0[lVar26 + -1] = dVar50;
          iVar38 = iVar38 + -1;
          lVar26 = lVar36;
        } while ((dVar50 != 0.0) || (NAN(dVar50)));
        bVar2 = 1 < (long)uVar34;
        uVar34 = uVar33;
      } while (bVar2);
    }
    operator_delete__(pvVar19);
    operator_delete__(__dest);
    operator_delete__(pvVar21);
    operator_delete__(pvVar22);
  }
  operator_delete__(pvVar18);
  operator_delete__(out);
  if (-1 < iVar41) {
    uVar33 = 0;
    do {
      if ((void *)plVar17[uVar33] != (void *)0x0) {
        operator_delete__((void *)plVar17[uVar33]);
      }
      if (f0_candidates[uVar33] != (double *)0x0) {
        operator_delete__(f0_candidates[uVar33]);
      }
      uVar33 = uVar33 + 1;
    } while (uVar39 != uVar33);
  }
  operator_delete__(plVar17);
  operator_delete__(f0_candidates);
  operator_delete__(pdVar13);
  return;
}

Assistant:

void Dio(const double *x, int x_length, int fs, const DioOption *option,
    double *temporal_positions, double *f0) {
  DioGeneralBody(x, x_length, fs, option->frame_period, option->f0_floor,
      option->f0_ceil, option->channels_in_octave, option->speed,
      option->allowed_range, temporal_positions, f0);
}